

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O1

zt_mem_pool_group * zt_mem_pool_group_init(zt_mem_pool_desc *group,size_t len)

{
  long lVar1;
  zt_mem_pool_group *pzVar2;
  zt_mem_pool **ppzVar3;
  zt_mem_pool *pzVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  
  pzVar2 = (zt_mem_pool_group *)zt_calloc_p(1,0x20);
  if (pzVar2 != (zt_mem_pool_group *)0x0) {
    ppzVar3 = (zt_mem_pool **)zt_calloc_p(len,8);
    pzVar2->pools = ppzVar3;
    if (ppzVar3 != (zt_mem_pool **)0x0) {
      (pzVar2->group_list).prev = (zt_elist *)pzVar2;
      (pzVar2->group_list).next = (zt_elist *)pzVar2;
      pzVar2->npools = len;
      if (len == 0) {
        return pzVar2;
      }
      piVar7 = &group->flags;
      lVar5 = 1;
      lVar6 = -8;
      while( true ) {
        if (((zt_mem_pool_desc *)(piVar7 + -10))->name == (char *)0x0) {
          return pzVar2;
        }
        pzVar4 = zt_mem_pool_init(((zt_mem_pool_desc *)(piVar7 + -10))->name,
                                  *(size_t *)(piVar7 + -8),*(size_t *)(piVar7 + -6),
                                  *(zt_page_release_test *)(piVar7 + -4),*(void **)(piVar7 + -2),
                                  *piVar7);
        *(zt_mem_pool **)((long)pzVar2->pools + lVar6 + 8) = pzVar4;
        if (*(long *)((long)pzVar2->pools + lVar6 + 8) == 0) break;
        lVar6 = lVar6 + 8;
        lVar1 = len + lVar5;
        lVar5 = lVar5 + -1;
        piVar7 = piVar7 + 0xc;
        if (lVar1 == 2) {
          return pzVar2;
        }
      }
      for (; lVar5 != 0; lVar5 = lVar5 + 1) {
        zt_mem_pool_destroy((zt_mem_pool **)((long)pzVar2->pools + lVar6));
        lVar6 = lVar6 + -8;
      }
    }
  }
  return (zt_mem_pool_group *)0x0;
}

Assistant:

zt_mem_pool_group *
zt_mem_pool_group_init(zt_mem_pool_desc *group, size_t len)
{
    zt_mem_pool_group * ngroup;
    size_t              i;

    if ((ngroup = zt_calloc(zt_mem_pool_group, 1)) == NULL) {
        return 0;
    }

    if ((ngroup->pools = zt_calloc(zt_mem_pool *, len)) == NULL) {
        return 0;
    }
    zt_elist_reset(&ngroup->group_list);
    ngroup->npools = len;

    for (i = 0; i < len && group[i].name; i++) {
        ngroup->pools[i] = zt_mem_pool_init(group[i].name,
                                            group[i].elts,
                                            group[i].size,
                                            group[i].release_test,
                                            group[i].cb_data,
                                            group[i].flags);
        if (!ngroup->pools[i]) {
            while (--i) {
                zt_mem_pool_destroy(&ngroup->pools[i]);
            }
            return 0;
        }
    }

    return ngroup;
}